

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

int cmp_init_el(void *p1,void *p2)

{
  long lVar1;
  long lVar2;
  type *ptVar3;
  mir_size_t mVar4;
  ulong uVar5;
  ulong uVar6;
  
  lVar1 = *(long *)((long)p1 + 0x18);
  if ((lVar1 == 0) || ((int)*(uint *)(lVar1 + 4) < 0)) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ulong)(*(uint *)(lVar1 + 4) >> 3);
  }
  lVar2 = *(long *)((long)p2 + 0x18);
  if ((lVar2 == 0) || ((int)*(uint *)(lVar2 + 4) < 0)) {
    uVar6 = 0;
  }
  else {
    uVar6 = (ulong)(*(uint *)(lVar2 + 4) >> 3);
  }
  uVar5 = uVar5 + *(long *)((long)p1 + 0x10);
  uVar6 = uVar6 + *(long *)((long)p2 + 0x10);
  if (uVar6 <= uVar5) {
    if (uVar6 < uVar5) {
      return 1;
    }
    if ((lVar1 == 0 || lVar2 == 0) || (*(int *)(lVar2 + 4) <= *(int *)(lVar1 + 4))) {
      if ((lVar1 != 0 && lVar2 != 0) && (*(int *)(lVar2 + 4) < *(int *)(lVar1 + 4))) {
        return 1;
      }
      if (lVar1 != 0) {
        ptVar3 = *(type **)(lVar1 + 0x40);
        mVar4 = raw_type_size(*p1,ptVar3);
        uVar5 = (ulong)ptVar3->align;
        if (uVar5 != 0) {
          uVar6 = (mVar4 - 1) + uVar5;
          mVar4 = uVar6 - uVar6 % uVar5;
        }
        if (mVar4 == 0) {
          return -1;
        }
      }
      if (*(long *)((long)p2 + 0x18) != 0) {
        ptVar3 = *(type **)(*(long *)((long)p2 + 0x18) + 0x40);
        mVar4 = raw_type_size(*p2,ptVar3);
        uVar5 = (ulong)ptVar3->align;
        if (uVar5 != 0) {
          uVar6 = (mVar4 - 1) + uVar5;
          mVar4 = uVar6 - uVar6 % uVar5;
        }
        if (mVar4 == 0) {
          return 1;
        }
      }
      if (*(ulong *)((long)p2 + 8) <= *(ulong *)((long)p1 + 8)) {
        return (uint)(*(ulong *)((long)p2 + 8) < *(ulong *)((long)p1 + 8));
      }
      return -1;
    }
  }
  return -1;
}

Assistant:

static int cmp_init_el (const void *p1, const void *p2) {
  const init_el_t *el1 = p1, *el2 = p2;
  int bit_offset1 = el1->member_decl == NULL || el1->member_decl->bit_offset < 0
                      ? 0
                      : el1->member_decl->bit_offset;
  int bit_offset2 = el2->member_decl == NULL || el2->member_decl->bit_offset < 0
                      ? 0
                      : el2->member_decl->bit_offset;

  if (el1->offset + bit_offset1 / MIR_CHAR_BIT < el2->offset + bit_offset2 / MIR_CHAR_BIT)
    return -1;
  else if (el1->offset + bit_offset1 / MIR_CHAR_BIT > el2->offset + bit_offset2 / MIR_CHAR_BIT)
    return 1;
  else if (el1->member_decl != NULL && el2->member_decl != NULL
           && el1->member_decl->bit_offset < el2->member_decl->bit_offset)
    return -1;
  else if (el1->member_decl != NULL && el2->member_decl != NULL
           && el1->member_decl->bit_offset > el2->member_decl->bit_offset)
    return 1;
  else if (el1->member_decl != NULL
           && type_size (el1->c2m_ctx, el1->member_decl->decl_spec.type) == 0)
    return -1;
  else if (el2->member_decl != NULL
           && type_size (el2->c2m_ctx, el2->member_decl->decl_spec.type) == 0)
    return 1;
  else if (el1->num < el2->num)
    return -1;
  else if (el1->num > el2->num)
    return 1;
  else
    return 0;
}